

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symtab.c
# Opt level: O2

int symtab_get(symtab *tab,char *name,int *ptype,int *pdata)

{
  int iVar1;
  symtab_sym *psVar2;
  uint32_t uVar3;
  int iVar4;
  int *piVar5;
  long lVar6;
  
  piVar5 = tab->buckets;
  uVar3 = elf_hash(name);
  piVar5 = piVar5 + (ulong)uVar3 % (ulong)(uint)tab->bucketsnum;
  while( true ) {
    iVar1 = *piVar5;
    lVar6 = (long)iVar1;
    if (lVar6 == -1) {
      return iVar1;
    }
    psVar2 = tab->syms;
    iVar4 = strcmp(psVar2[lVar6].name,name);
    if (iVar4 == 0) break;
    piVar5 = &psVar2[lVar6].hchain;
  }
  if (ptype != (int *)0x0) {
    *ptype = psVar2[lVar6].type;
  }
  if (pdata == (int *)0x0) {
    return iVar1;
  }
  *pdata = psVar2[lVar6].data;
  return iVar1;
}

Assistant:

int symtab_get(struct symtab *tab, const char *name, int *ptype, int *pdata) {
	int i = tab->buckets[elf_hash(name) % tab->bucketsnum];
	while (i != -1) {
		if (!strcmp(tab->syms[i].name, name)) {
			if (ptype)
				*ptype = tab->syms[i].type;
			if (pdata)
				*pdata = tab->syms[i].data;
			return i;
		}
		i = tab->syms[i].hchain;
	}
	return -1;
}